

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchCharNode::AnnotatePass1
          (MatchCharNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  CharSet<char16_t> *this_00;
  int iVar2;
  int local_5c;
  int i;
  TrackAllocData local_48;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool parentNotNegated_local;
  bool parentNotSpeculative_local;
  bool parentAtLeastOnce_local;
  Compiler *pCStack_18;
  bool parentNotInLoop_local;
  Compiler *compiler_local;
  MatchCharNode *this_local;
  
  (this->super_Node).features = 0x20;
  local_1c = parentNotNegated;
  local_1b = parentNotSpeculative;
  local_1a = parentAtLeastOnce;
  local_19 = parentNotInLoop;
  pCStack_18 = compiler;
  compiler_local = (Compiler *)this;
  CountDomain::Exact(&(this->super_Node).thisConsumes,1);
  pAVar1 = &pCStack_18->ctAllocator->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&CharSet<char16_t>::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
             ,0x4e0);
  pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar1,&local_48);
  this_00 = (CharSet<char16_t> *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar1,0x3f67b0)
  ;
  CharSet<char16_t>::CharSet(this_00);
  (this->super_Node).firstSet = this_00;
  local_5c = 0;
  while( true ) {
    iVar2 = 1;
    if ((this->isEquivClass & 1U) != 0) {
      iVar2 = 4;
    }
    if (iVar2 <= local_5c) break;
    CharSet<char16_t>::Set((this->super_Node).firstSet,pCStack_18->ctAllocator,this->cs[local_5c]);
    local_5c = local_5c + 1;
  }
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe | 1;
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffef | 0x10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffdf | 0x20;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffbff | (uint)(local_19 & 1) << 10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffff7ff | (uint)(local_1a & 1) << 0xb;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffefff | (uint)(local_1b & 1) << 0xc;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffdfff | (uint)(local_1c & 1) << 0xd;
  return;
}

Assistant:

void MatchCharNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasMatchChar;
        thisConsumes.Exact(1);
        firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
        for (int i = 0; i < (isEquivClass ? CaseInsensitive::EquivClassSize : 1); i++)
            firstSet->Set(compiler.ctAllocator, cs[i]);
        isFirstExact = true;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
    }